

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O0

wchar_t artifact_power(wchar_t a_idx,char *reason,_Bool verbose)

{
  _Bool _Var1;
  wchar_t wVar2;
  char local_138 [4];
  int32_t power;
  char buf [256];
  object *local_30;
  object *known_obj;
  object *obj;
  char *pcStack_18;
  _Bool verbose_local;
  char *reason_local;
  wchar_t a_idx_local;
  
  obj._7_1_ = verbose;
  pcStack_18 = reason;
  reason_local._0_4_ = a_idx;
  known_obj = object_new();
  local_30 = object_new();
  file_putf(log_file,"********** Evaluating %s ********\n",pcStack_18);
  file_putf(log_file,"Artifact index is %d\n",(ulong)(uint)(wchar_t)reason_local);
  _Var1 = make_fake_artifact(known_obj,a_info + (wchar_t)reason_local);
  if (_Var1) {
    object_copy(local_30,known_obj);
    known_obj->known = local_30;
    object_desc(local_138,0x100,known_obj,99,(player *)0x0);
    file_putf(log_file,"%s\n",local_138);
    wVar2 = object_power(known_obj,(_Bool)(obj._7_1_ & 1),log_file);
    object_delete((chunk *)0x0,(chunk *)0x0,&local_30);
    object_delete((chunk *)0x0,(chunk *)0x0,&known_obj);
    reason_local._4_4_ = wVar2;
  }
  else {
    object_delete((chunk *)0x0,(chunk *)0x0,&local_30);
    object_delete((chunk *)0x0,(chunk *)0x0,&known_obj);
    reason_local._4_4_ = L'\0';
  }
  return reason_local._4_4_;
}

Assistant:

static int artifact_power(int a_idx, const char *reason, bool verbose)
{
	struct object *obj = object_new();
	struct object *known_obj = object_new();
	char buf[256];
	int32_t power;

	file_putf(log_file, "********** Evaluating %s ********\n", reason);
	file_putf(log_file, "Artifact index is %d\n", a_idx);

	if (!make_fake_artifact(obj, &a_info[a_idx])) {
		object_delete(NULL, NULL, &known_obj);
		object_delete(NULL, NULL, &obj);
		return 0;
	}

	object_copy(known_obj, obj);
	obj->known = known_obj;
	object_desc(buf, 256 * sizeof(char), obj,
		ODESC_PREFIX | ODESC_FULL | ODESC_SPOIL, NULL);
	file_putf(log_file, "%s\n", buf);

	power = object_power(obj, verbose, log_file);

	object_delete(NULL, NULL, &known_obj);
	object_delete(NULL, NULL, &obj);
	return power;
}